

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PinHole.cpp
# Opt level: O3

void __thiscall
pm::PinHole::renderScene
          (PinHole *this,World *world,Tracer *tracer,RGBColor *frame,int startX,int startY,
          int tileWidth,int tileHeight,bool progressive)

{
  float fVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined1 auVar4 [16];
  int iVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  undefined4 in_register_00000084;
  int iVar9;
  float fVar10;
  float fVar11;
  undefined1 auVar12 [16];
  Vector3 VVar13;
  Vector2 sp;
  int local_ac;
  float local_a8;
  _func_int **local_88;
  float local_80;
  ulong local_78;
  float local_70;
  float local_6c;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  undefined8 local_50;
  float local_48;
  _func_int **local_44;
  float local_3c;
  RGBColor *local_38;
  
  local_78 = CONCAT44(in_register_00000084,startX);
  local_44 = (_func_int **)0x3f800000;
  local_3c = 0.0;
  local_50._0_4_ = (this->super_Camera).eye_.x;
  local_50._4_4_ = (this->super_Camera).eye_.y;
  local_48 = (this->super_Camera).eye_.z;
  fVar10 = (world->viewplane_).pixelSize_ / this->zoom_;
  iVar5 = 1;
  local_38 = frame;
  if (!progressive) {
    iVar5 = SamplerState::numSamples(&(world->viewplane_).samplerState_);
  }
  if (0 < tileHeight) {
    iVar6 = (int)local_78;
    local_ac = startY;
    do {
      if (0 < tileWidth) {
        uVar8 = local_78 & 0xffffffff;
        do {
          iVar7 = (int)uVar8;
          if (iVar5 < 1) {
            local_68 = 0.0;
            fStack_64 = 0.0;
            fStack_60 = 0.0;
            fStack_5c = 0.0;
            local_a8 = 0.0;
          }
          else {
            local_68 = 0.0;
            fStack_64 = 0.0;
            fStack_60 = 0.0;
            fStack_5c = 0.0;
            local_a8 = 0.0;
            iVar9 = iVar5;
            do {
              SamplerState::sampleUnitSquare((SamplerState *)&local_70);
              VVar13 = rayDirection((PinHole *)&local_88,
                                    ((float)(world->viewplane_).width_ * -0.5 + (float)iVar7 +
                                    local_70) * fVar10,
                                    ((float)(world->viewplane_).height_ * -0.5 + (float)local_ac +
                                    local_6c) * fVar10);
              local_44 = local_88;
              local_3c = local_80;
              (*tracer->_vptr_Tracer[3])
                        (local_80,VVar13.z,(PinHole *)&local_88,tracer,world,&local_50,0);
              local_68 = local_68 + SUB84(local_88,0);
              fStack_64 = fStack_64 + (float)((ulong)local_88 >> 0x20);
              fStack_60 = fStack_60 + 0.0;
              fStack_5c = fStack_5c + 0.0;
              local_a8 = local_a8 + local_80;
              iVar9 = iVar9 + -1;
            } while (iVar9 != 0);
          }
          iVar9 = SamplerState::numSamples(&(world->viewplane_).samplerState_);
          fVar11 = (float)iVar9;
          fVar1 = (this->super_Camera).exposureTime_;
          iVar9 = (world->viewplane_).width_ * local_ac + iVar7;
          auVar4._4_4_ = fStack_64;
          auVar4._0_4_ = local_68;
          auVar4._8_4_ = fStack_60;
          auVar4._12_4_ = fStack_5c;
          auVar12._4_4_ = fVar11;
          auVar12._0_4_ = fVar11;
          auVar12._8_8_ = 0;
          auVar12 = divps(auVar4,auVar12);
          uVar2 = local_38[iVar9].r;
          uVar3 = local_38[iVar9].g;
          local_38[iVar9].r = (float)uVar2 + fVar1 * auVar12._0_4_;
          local_38[iVar9].g = (float)uVar3 + fVar1 * auVar12._4_4_;
          local_38[iVar9].b = (local_a8 / fVar11) * fVar1 + local_38[iVar9].b;
          uVar8 = (ulong)(iVar7 + 1U);
        } while ((int)(iVar7 + 1U) < iVar6 + tileWidth);
      }
      local_ac = local_ac + 1;
    } while (local_ac < tileHeight + startY);
  }
  return;
}

Assistant:

void PinHole::renderScene(World &world, Tracer &tracer, RGBColor *frame, int startX, int startY, int tileWidth, int tileHeight, bool progressive)
{
	Ray ray;
	ray.o = eye_;
	const ViewPlane &vp = world.viewPlane();

	int depth = 0; // recursion depth
	const float pixelSize = vp.pixelSize() / zoom_;

	const int numSamples = progressive ? 1 : vp.samplerState().numSamples();
	for (int r = startY; r < startY + tileHeight; r++)
	{
		for (int c = startX; c < startX + tileWidth; c++)
		{
			RGBColor pixel(0.0f, 0.0f, 0.0f);
			for (int j = 0; j < numSamples; j++)
			{
				const Vector2 sp = vp.samplerState().sampleUnitSquare();
				const float x = pixelSize * (c - 0.5f * vp.width() + sp.x);
				const float y = pixelSize * (r - 0.5f * vp.height() + sp.y);
				ray.d = rayDirection(x, y);
				pixel += tracer.traceRay(world, ray, depth);
			}
			// Divide by number of samples even in progressive mode or the image gets too bright
			pixel /= static_cast<float>(vp.samplerState().numSamples());
			pixel *= exposureTime_;
			frame[r * vp.width() + c] += pixel;
		}
	}
}